

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O3

int CBS_is_valid_asn1_bitstring(CBS *cbs)

{
  byte bVar1;
  size_t sVar2;
  uint uVar3;
  
  sVar2 = cbs->len;
  uVar3 = 0;
  if (sVar2 != 0) {
    bVar1 = *cbs->data;
    if (bVar1 < 8) {
      if (bVar1 == 0) {
        return 1;
      }
      if (sVar2 != 1) {
        uVar3 = (uint)(((uint)cbs->data[sVar2 - 1] & ~(-1 << (bVar1 & 0x1f))) == 0);
      }
    }
  }
  return uVar3;
}

Assistant:

int CBS_is_valid_asn1_bitstring(const CBS *cbs) {
  CBS in = *cbs;
  uint8_t num_unused_bits;
  if (!CBS_get_u8(&in, &num_unused_bits) || num_unused_bits > 7) {
    return 0;
  }

  if (num_unused_bits == 0) {
    return 1;
  }

  // All num_unused_bits bits must exist and be zeros.
  uint8_t last;
  if (!CBS_get_last_u8(&in, &last) ||
      (last & ((1 << num_unused_bits) - 1)) != 0) {
    return 0;
  }

  return 1;
}